

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ulong uVar1;
  uint uVar2;
  size_type sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  int value;
  uniform_int_distribution<int> dis;
  set<int,_std::less<int>,_std::allocator<int>_> all;
  random_device rd;
  mt19937 gen;
  double local_3790;
  result_type local_3784;
  uniform_int_distribution<int> local_3780;
  long local_3778;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> local_3770 [8];
  undefined4 local_3768 [2];
  undefined8 local_3760;
  undefined4 *local_3758;
  undefined4 *local_3750;
  ulong local_3748;
  random_device local_3740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_23b8;
  hyper_log_log<int,_12UL> local_1030;
  
  std::random_device::random_device(&local_3740);
  uVar2 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_23b8,(ulong)uVar2);
  memset(&local_1030,0,0x1000);
  local_3790 = 0.0;
  lVar7 = 0;
  while (lVar7 != 0x20) {
    local_3768[0] = 0;
    uVar2 = *(uint *)((long)&DAT_00102068 + lVar7);
    local_3760 = 0;
    local_3780._M_param._M_a = 1;
    local_3758 = local_3768;
    local_3748 = 0;
    iVar5 = 1000000;
    local_3780._M_param._M_b = uVar2;
    local_3778 = lVar7;
    local_3750 = local_3758;
    while (uVar1 = local_3748, bVar8 = iVar5 != 0, iVar5 = iVar5 + -1, bVar8) {
      local_3784 = std::uniform_int_distribution<int>::operator()(&local_3780,&local_23b8);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>(local_3770,&local_3784);
      hll::hyper_log_log<int,_12UL>::add(&local_1030,&local_3784);
    }
    sVar3 = hll::hyper_log_log<int,_12UL>::count(&local_1030);
    iVar6 = (int)uVar1;
    iVar4 = (int)sVar3 - iVar6;
    iVar5 = -iVar4;
    if (0 < iVar4) {
      iVar5 = iVar4;
    }
    local_3790 = local_3790 + (double)iVar5 / (double)iVar6;
    printf("%d numbers in range [1 .. %d], %d uniq, %d result, %.5f relative error\n",1000000,
           (ulong)uVar2,uVar1 & 0xffffffff,sVar3 & 0xffffffff);
    hll::hyper_log_log<int,_12UL>::clear(&local_1030);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_3770);
    lVar7 = local_3778 + 4;
  }
  printf("Average error: %.5f\n",local_3790 * 0.125);
  printf("Paper estimated error: %.5f\n",0x3f90a3d70a3d70a4);
  std::random_device::~random_device(&local_3740);
  return 0;
}

Assistant:

int main() {
    std::random_device rd;
    std::mt19937 gen(rd());

    constexpr int N = (int) 1e6;

    double error_count = 0.0;
    int count = 0;


    hll::hyper_log_log<int, 12> counter{};
    for (int k : {100, 1000, 10000, N / 10, N, N * 10, N * 100, N * 1000}) {
        std::uniform_int_distribution<> dis(1, k);
        std::set<int> all;

        for (int i = 0; i < N; i++) {
            int value = dis(gen);
            all.insert(value);
            counter.add(value);
        }
        int expected = (int) all.size();
        int counter_result = counter.count();
        double error = relative_error(expected, counter_result);
        error_count += error;
        count += 1;
        printf("%d numbers in range [1 .. %d], %d uniq, %d result, %.5f relative error\n", N, k, expected, counter_result, error);

        counter.clear();
    }

    printf("Average error: %.5f\n", error_count / count);
    printf("Paper estimated error: %.5f\n", counter.get_relative_error());
    return 0;
}